

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

int bsplitscb(const_bstring str,const_bstring splitStr,int pos,_func_int_void_ptr_int_int *cb,
             void *parm)

{
  int iVar1;
  int local_64;
  int local_60;
  int ret;
  int p;
  int i;
  charField chrs;
  void *parm_local;
  _func_int_void_ptr_int_int *cb_local;
  int pos_local;
  const_bstring splitStr_local;
  const_bstring str_local;
  
  if (((((cb == (_func_int_void_ptr_int_int *)0x0) || (str == (const_bstring)0x0)) || (pos < 0)) ||
      ((str->slen < pos || (splitStr == (const_bstring)0x0)))) || (splitStr->slen < 0)) {
    str_local._4_4_ = -1;
  }
  else {
    chrs.content._24_8_ = parm;
    if (splitStr->slen == 0) {
      local_64 = (*cb)(parm,0,str->slen);
      if (0 < local_64) {
        local_64 = 0;
      }
      str_local._4_4_ = local_64;
    }
    else if (splitStr->slen == 1) {
      str_local._4_4_ = bsplitcb(str,*splitStr->data,pos,cb,parm);
    }
    else {
      buildCharField((charField *)&p,splitStr);
      local_60 = pos;
      do {
        ret = local_60;
        while ((ret < str->slen &&
               (((ulong)*(byte *)((long)&p + (long)((int)(uint)str->data[ret] >> 3)) &
                1L << (str->data[ret] & 7)) == 0))) {
          ret = ret + 1;
        }
        iVar1 = (*cb)((void *)chrs.content._24_8_,local_60,ret - local_60);
        if (iVar1 < 0) {
          return iVar1;
        }
        local_60 = ret + 1;
      } while (local_60 <= str->slen);
      str_local._4_4_ = 0;
    }
  }
  return str_local._4_4_;
}

Assistant:

int bsplitscb (const_bstring str, const_bstring splitStr, int pos,
	int (* cb) (void * parm, int ofs, int len), void * parm) {
struct charField chrs;
int i, p, ret;

	if (cb == NULL || str == NULL || pos < 0 || pos > str->slen
	 || splitStr == NULL || splitStr->slen < 0) return BSTR_ERR;
	if (splitStr->slen == 0) {
		if ((ret = cb (parm, 0, str->slen)) > 0) ret = 0;
		return ret;
	}

	if (splitStr->slen == 1)
		return bsplitcb (str, splitStr->data[0], pos, cb, parm);

	buildCharField (&chrs, splitStr);

	p = pos;
	do {
		for (i=p; i < str->slen; i++) {
			if (testInCharField (&chrs, str->data[i])) break;
		}
		if ((ret = cb (parm, p, i - p)) < 0) return ret;
		p = i + 1;
	} while (p <= str->slen);
	return BSTR_OK;
}